

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  anon_class_1_0_00000001 local_c1;
  function<void_()> local_c0;
  Thread local_a0;
  int local_5c [3];
  initializer_list<int> local_50;
  undefined1 local_40 [8];
  List<int> list;
  
  local_5c[0] = 1;
  local_5c[1] = 2;
  local_5c[2] = 3;
  local_50._M_array = local_5c;
  local_50._M_len = 3;
  cplus::utils::List<int>::List((List<int> *)local_40,&local_50);
  std::function<void()>::function<main::__0,void>((function<void()> *)&local_c0,&local_c1);
  cplus::thread::Thread::Thread(&local_a0,&local_c0);
  cplus::thread::Thread::start(&local_a0);
  cplus::thread::Thread::~Thread(&local_a0);
  std::function<void_()>::~function(&local_c0);
  cplus::thread::Thread::exitThread();
  cplus::utils::List<int>::~List((List<int> *)local_40);
  return 0;
}

Assistant:

int main() {
	cplus::utils::List<int> list{1, 2, 3};
	//启动服务器
	Thread([]() -> void {
		SocketServer server(port);
		server.listen();
		println({&String::getString("server started at port: "), &Short::get(port)});
		auto buffer = ByteBuffer(1024);
		while (true) {
			auto socket = server.accept();
			try {
				println({&String::getString("server got connection from:"), &socket.getAddress()});
				while (true) {
					socket.read(buffer);
					println({&String::getString("server recv from:"), &socket.getAddress()});
					println({String::getString(">>>"), buffer.getString()});
					socket.write(buffer);
				}
			} catch (const Exception &e) {
				std::cerr << e.getMessage().c_str() << std::endl
				          << e.getStackTrace().c_str() << std::endl;
				socket.close();
			} catch (const std::exception &e) {
				std::cerr << "server exception: " << e.what() << std::endl;
				socket.close();
			} catch (int e) {
				std::cerr << e << std::endl;
				socket.close();
			}
		}
	}).start();


//	Thread::msleep(100);
//	try {
//		auto message = ByteArray("hello?", sizeof("hello?"));
//		auto socket = Socket("127.0.0.1", port);
//
//		socket.connect();
//		println(2, &String::getString("connecting to server: localhost: )"),
//		        &String::getString(String(port)));
//
//		Thread::msleep(100);
//		ssize_t sendSize = socket.send(message);
//		if (sendSize == -1) {
//		throw Exception("send error: " + Long(errno).toString());
//		} else {
//			println(2, &String::getString("sending size: "),
//			        &String::getString(String(sendSize)));
//		}
//
//		auto recv = socket.recv(1024);
//		println(2, &String::getString("recving from server:\n>>>"),
//		        &String::getString(String(recv)));
	
	//} catch (Exception e) {
	//	std::cerr << e.getMessage().c_str() << std::endl
	//	          << e.getStackTrace().c_str() << std::endl;
	//} catch (std::exception e) {
	//	std::cerr << "client exception: " << e.what() << std::endl;
	//}

//	ServerHandler serverHandler;
//	Thread([]() {
//		try {
//			u_int16_t port = 12346;
//			SocketServer server(port);
//			ByteArray recv(1024);
//			std::cout << "server started at port " << port << std::endl;
//			while (true) {
//				auto socket = server.accept();
//				std::cout << "get connection on: " << socket.getAddress().stdString()
//				          << ":" << socket.getPort() << std::endl;
//				socket.recv(recv);
//				socket.send(recv);
//				std::cout << String(recv).stdString() << std::endl;
//				std::cout << recv.toHexString().stdString() << std::endl;
//				if (String(recv.getBuffer()) == String("exit"))
//					break;
//			}
//		} catch (SocketServer::ServerException e) {
//			std::cerr << e.getMessage().stdString() << std::endl;
//		}
//	}).start();
//	Thread::detachAll();
	Thread::exitThread();
}